

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomNumberGenerator.cc
# Opt level: O2

void __thiscall
OpenMesh::RandomNumberGenerator::RandomNumberGenerator
          (RandomNumberGenerator *this,size_t _resolution)

{
  ulong uVar1;
  uint i;
  uint uVar2;
  undefined1 auVar3 [16];
  double dVar4;
  
  this->resolution_ = _resolution;
  this->iterations_ = 1;
  this->maxNum_ = 2147483648.0;
  auVar3._8_4_ = (int)(_resolution >> 0x20);
  auVar3._0_8_ = _resolution;
  auVar3._12_4_ = 0x45300000;
  uVar1 = 0;
  for (dVar4 = (auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)_resolution) - 4503599627370496.0);
      2147483648.0 < dVar4; dVar4 = dVar4 * 4.656612873077393e-10) {
    this->iterations_ = uVar1 + 2;
    uVar1 = uVar1 + 1;
  }
  dVar4 = 2147483648.0;
  for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    dVar4 = dVar4 * 2147483648.0;
    this->maxNum_ = dVar4;
  }
  return;
}

Assistant:

RandomNumberGenerator::RandomNumberGenerator(const size_t _resolution) :
  resolution_(_resolution),
  iterations_(1),
  maxNum_(RAND_MAX + 1.0)
{
  double tmp = double(resolution_);
  while (tmp > (double(RAND_MAX) + 1.0) ) {
    iterations_++;
    tmp /= (double(RAND_MAX) + 1.0);
  }

  for ( unsigned int i = 0 ; i < iterations_ - 1; ++i ) {
    maxNum_ *= (RAND_MAX + 1.0);
  }
}